

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O0

ssize_t __thiscall icu_63::VTimeZone::write(VTimeZone *this,int __fd,void *__buf,size_t __n)

{
  ConstChar16Ptr *this_00;
  uint uVar1;
  UErrorCode *this_01;
  UBool UVar2;
  char16_t cVar3;
  uint uVar4;
  int32_t iVar5;
  ulong uVar6;
  UnicodeString *pUVar7;
  ulong extraout_RAX;
  ulong uVar8;
  size_t sVar9;
  UErrorCode *__n_00;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  void *__buf_07;
  void *__buf_08;
  void *__buf_09;
  undefined4 in_register_00000034;
  bool bVar10;
  undefined1 local_f8 [8];
  UVector customProps;
  UnicodeString icutzprop;
  UnicodeString utcString;
  ConstChar16Ptr local_38;
  UnicodeString *local_30;
  UnicodeString *line;
  UErrorCode *pUStack_20;
  int32_t i;
  UErrorCode *status_local;
  VTZWriter *writer_local;
  VTimeZone *this_local;
  
  status_local = (UErrorCode *)CONCAT44(in_register_00000034,__fd);
  pUStack_20 = (UErrorCode *)__buf;
  writer_local = (VTZWriter *)this;
  if (this->vtzlines == (UVector *)0x0) {
    UnicodeString::UnicodeString((UnicodeString *)&customProps.comparer);
    UVector::UVector((UVector *)local_f8,(UObjectDeleter *)0x0,uhash_compareUnicodeString_63,
                     pUStack_20);
    iVar5 = UnicodeString::length(&this->olsonzid);
    if ((0 < iVar5) && (iVar5 = UnicodeString::length(&this->icutzver), 0 < iVar5)) {
      UnicodeString::append((UnicodeString *)&customProps.comparer,&this->olsonzid);
      UnicodeString::append((UnicodeString *)&customProps.comparer,L'[');
      UnicodeString::append((UnicodeString *)&customProps.comparer,&this->icutzver);
      UnicodeString::append((UnicodeString *)&customProps.comparer,L']');
      UVector::addElement((UVector *)local_f8,&customProps.comparer,pUStack_20);
    }
    writeZone(this,(VTZWriter *)status_local,this->tz,(UVector *)local_f8,pUStack_20);
    UVector::~UVector((UVector *)local_f8);
    UnicodeString::~UnicodeString((UnicodeString *)&customProps.comparer);
    uVar6 = extraout_RAX;
  }
  else {
    line._4_4_ = 0;
    while( true ) {
      uVar1 = line._4_4_;
      uVar4 = UVector::size(this->vtzlines);
      uVar8 = (ulong)uVar4;
      uVar6 = (ulong)uVar1;
      if ((int)uVar4 <= (int)uVar1) break;
      pUVar7 = (UnicodeString *)UVector::elementAt(this->vtzlines,line._4_4_);
      local_30 = pUVar7;
      ConstChar16Ptr::ConstChar16Ptr(&local_38,(char16_t *)ICAL_TZURL);
      UVar2 = UnicodeString::startsWith(pUVar7,&local_38,-1);
      pUVar7 = local_30;
      sVar9 = CONCAT71((int7)(uVar8 >> 8),UVar2);
      bVar10 = false;
      if (UVar2 != '\0') {
        iVar5 = u_strlen_63((UChar *)ICAL_TZURL);
        cVar3 = UnicodeString::charAt(pUVar7,iVar5);
        bVar10 = cVar3 == L':';
      }
      ConstChar16Ptr::~ConstChar16Ptr(&local_38);
      pUVar7 = local_30;
      if (bVar10) {
        VTZWriter::write((VTZWriter *)status_local,0x3de12e,__buf_00,sVar9);
        VTZWriter::write((VTZWriter *)status_local,0x3a,__buf_01,sVar9);
        VTZWriter::write((VTZWriter *)status_local,(int)this + 0x58,__buf_02,sVar9);
        VTZWriter::write((VTZWriter *)status_local,0x3de20e,__buf_03,sVar9);
      }
      else {
        this_00 = (ConstChar16Ptr *)((long)&utcString.fUnion + 0x30);
        ConstChar16Ptr::ConstChar16Ptr(this_00,(char16_t *)ICAL_LASTMOD);
        UVar2 = UnicodeString::startsWith(pUVar7,this_00,-1);
        pUVar7 = local_30;
        sVar9 = CONCAT71((int7)(sVar9 >> 8),UVar2);
        bVar10 = false;
        if (UVar2 != '\0') {
          iVar5 = u_strlen_63((UChar *)ICAL_LASTMOD);
          cVar3 = UnicodeString::charAt(pUVar7,iVar5);
          bVar10 = cVar3 == L':';
        }
        ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)((long)&utcString.fUnion + 0x30));
        if (bVar10) {
          UnicodeString::UnicodeString((UnicodeString *)((long)&icutzprop.fUnion + 0x30));
          VTZWriter::write((VTZWriter *)status_local,0x3de140,__buf_05,sVar9);
          VTZWriter::write((VTZWriter *)status_local,0x3a,__buf_06,sVar9);
          this_01 = status_local;
          __n_00 = status_local;
          pUVar7 = getUTCDateTimeString
                             (this->lastmod,(UnicodeString *)((long)&icutzprop.fUnion + 0x30));
          VTZWriter::write((VTZWriter *)this_01,(int)pUVar7,__buf_07,(size_t)__n_00);
          VTZWriter::write((VTZWriter *)status_local,0x3de20e,__buf_08,(size_t)__n_00);
          UnicodeString::~UnicodeString((UnicodeString *)((long)&icutzprop.fUnion + 0x30));
        }
        else {
          VTZWriter::write((VTZWriter *)status_local,(int)local_30,__buf_04,sVar9);
          VTZWriter::write((VTZWriter *)status_local,0x3de20e,__buf_09,sVar9);
        }
      }
      line._4_4_ = line._4_4_ + 1;
    }
  }
  return uVar6;
}

Assistant:

void
VTimeZone::write(VTZWriter& writer, UErrorCode& status) const {
    if (vtzlines != NULL) {
        for (int32_t i = 0; i < vtzlines->size(); i++) {
            UnicodeString *line = (UnicodeString*)vtzlines->elementAt(i);
            if (line->startsWith(ICAL_TZURL, -1)
                && line->charAt(u_strlen(ICAL_TZURL)) == COLON) {
                writer.write(ICAL_TZURL);
                writer.write(COLON);
                writer.write(tzurl);
                writer.write(ICAL_NEWLINE);
            } else if (line->startsWith(ICAL_LASTMOD, -1)
                && line->charAt(u_strlen(ICAL_LASTMOD)) == COLON) {
                UnicodeString utcString;
                writer.write(ICAL_LASTMOD);
                writer.write(COLON);
                writer.write(getUTCDateTimeString(lastmod, utcString));
                writer.write(ICAL_NEWLINE);
            } else {
                writer.write(*line);
                writer.write(ICAL_NEWLINE);
            }
        }
    } else {
        UnicodeString icutzprop;
        UVector customProps(nullptr, uhash_compareUnicodeString, status);
        if (olsonzid.length() > 0 && icutzver.length() > 0) {
            icutzprop.append(olsonzid);
            icutzprop.append(u'[');
            icutzprop.append(icutzver);
            icutzprop.append(u']');
            customProps.addElement(&icutzprop, status);
        }
        writeZone(writer, *tz, &customProps, status);
    }
}